

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrPerformanceMetricsStateMETA *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string type_prefix;
  string enabled_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream oss_enabled;
  
  PointerToHexString<XrPerformanceMetricsStateMETA>
            ((XrPerformanceMetricsStateMETA *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_enabled);
  std::__cxx11::string::~string((string *)&oss_enabled);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_enabled,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_enabled);
    std::__cxx11::string::~string((string *)&oss_enabled);
  }
  else {
    _oss_enabled = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_enabled);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&oss_enabled
              );
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_1c8,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1c8,contents);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (bVar2) {
    std::__cxx11::string::string((string *)&enabled_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&enabled_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enabled);
    poVar4 = std::operator<<((ostream *)&oss_enabled,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrBool32",&enabled_prefix,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enabled);
    std::__cxx11::string::~string((string *)&enabled_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrPerformanceMetricsStateMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string enabled_prefix = prefix;
        enabled_prefix += "enabled";
        std::ostringstream oss_enabled;
        oss_enabled << "0x" << std::hex << (value->enabled);
        contents.emplace_back("XrBool32", enabled_prefix, oss_enabled.str());
        return true;
    } catch(...) {
    }
    return false;
}